

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::reactor_op>::pop(op_queue<asio::detail::reactor_op> *this)

{
  reactor_op *prVar1;
  reactor_op *local_18;
  reactor_op *tmp;
  op_queue<asio::detail::reactor_op> *this_local;
  
  if (this->front_ != (reactor_op *)0x0) {
    local_18 = this->front_;
    tmp = (reactor_op *)this;
    prVar1 = op_queue_access::next<asio::detail::reactor_op>(this->front_);
    this->front_ = prVar1;
    if (this->front_ == (reactor_op *)0x0) {
      this->back_ = (reactor_op *)0x0;
    }
    op_queue_access::next<asio::detail::reactor_op,asio::detail::reactor_op>
              (&local_18,(reactor_op *)0x0);
  }
  return;
}

Assistant:

void pop()
  {
    if (front_)
    {
      Operation* tmp = front_;
      front_ = op_queue_access::next(front_);
      if (front_ == 0)
        back_ = 0;
      op_queue_access::next(tmp, static_cast<Operation*>(0));
    }
  }